

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::PrefixUnaryExpressionSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if ((kind - UnaryBitwiseAndExpression < 7) || (kind - UnaryLogicalNotExpression < 5)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool PrefixUnaryExpressionSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::UnaryBitwiseAndExpression:
        case SyntaxKind::UnaryBitwiseNandExpression:
        case SyntaxKind::UnaryBitwiseNorExpression:
        case SyntaxKind::UnaryBitwiseNotExpression:
        case SyntaxKind::UnaryBitwiseOrExpression:
        case SyntaxKind::UnaryBitwiseXnorExpression:
        case SyntaxKind::UnaryBitwiseXorExpression:
        case SyntaxKind::UnaryLogicalNotExpression:
        case SyntaxKind::UnaryMinusExpression:
        case SyntaxKind::UnaryPlusExpression:
        case SyntaxKind::UnaryPredecrementExpression:
        case SyntaxKind::UnaryPreincrementExpression:
            return true;
        default:
            return false;
    }
}